

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

uint32_t read_one_tile_group_obu
                   (AV1Decoder *pbi,aom_read_bit_buffer *rb,int is_first_tg,uint8_t *data,
                   uint8_t *data_end,uint8_t **p_data_end,int *is_last_tg,int tile_start_implicit)

{
  undefined8 uVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int *in_RCX;
  undefined4 in_EDX;
  AV1Decoder *in_RSI;
  long in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int32_t tg_payload_size;
  int32_t header_size;
  int end_tile;
  int start_tile;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_48;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = read_tile_group_header
                    (in_RSI,(aom_read_bit_buffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX
                     ,in_R8,(int)((ulong)in_R9 >> 0x20));
  iVar4 = (int)in_RCX;
  if (iVar2 != -1) {
    iVar3 = byte_alignment((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (aom_read_bit_buffer *)0x1d47b2);
    if (iVar3 == 0) {
      iVar4 = iVar4 + iVar2;
      av1_decode_tg_tiles_and_wrapup
                ((AV1Decoder *)p_data_end,(uint8_t *)cm,_end_tile,_tg_payload_size,unaff_retaddr_00,
                 unaff_retaddr,(int)data);
      uVar1 = *in_R9;
      *(uint *)_tg_payload_size =
           (uint)(local_48 == *(int *)(in_RDI + 0x9c04) * *(int *)(in_RDI + 0x9c00) + -1);
      return iVar2 + ((int)uVar1 - iVar4);
    }
  }
  return 0;
}

Assistant:

static uint32_t read_one_tile_group_obu(
    AV1Decoder *pbi, struct aom_read_bit_buffer *rb, int is_first_tg,
    const uint8_t *data, const uint8_t *data_end, const uint8_t **p_data_end,
    int *is_last_tg, int tile_start_implicit) {
  AV1_COMMON *const cm = &pbi->common;
  int start_tile, end_tile;
  int32_t header_size, tg_payload_size;

  assert((rb->bit_offset & 7) == 0);
  assert(rb->bit_buffer + aom_rb_bytes_read(rb) == data);

  header_size = read_tile_group_header(pbi, rb, &start_tile, &end_tile,
                                       tile_start_implicit);
  if (header_size == -1 || byte_alignment(cm, rb)) return 0;
  data += header_size;
  av1_decode_tg_tiles_and_wrapup(pbi, data, data_end, p_data_end, start_tile,
                                 end_tile, is_first_tg);

  tg_payload_size = (uint32_t)(*p_data_end - data);

  *is_last_tg = end_tile == cm->tiles.rows * cm->tiles.cols - 1;
  return header_size + tg_payload_size;
}